

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csp_io.c
# Opt level: O1

int csp_transaction_w_opts
              (uint8_t prio,uint16_t dest,uint8_t port,uint32_t timeout,void *outbuf,int outlen,
              void *inbuf,int inlen,uint32_t opts)

{
  int iVar1;
  csp_conn_t *conn;
  
  conn = csp_connect(prio,dest,port,0,opts);
  if (conn == (csp_conn_t *)0x0) {
    iVar1 = 0;
  }
  else {
    iVar1 = csp_transaction_persistent(conn,timeout,outbuf,outlen,inbuf,inlen);
    csp_close(conn);
  }
  return iVar1;
}

Assistant:

int csp_transaction_w_opts(uint8_t prio, uint16_t dest, uint8_t port, uint32_t timeout, const void * outbuf, int outlen, void * inbuf, int inlen, uint32_t opts) {

	csp_conn_t * conn = csp_connect(prio, dest, port, 0, opts);
	if (conn == NULL)
		return 0;

	int status = csp_transaction_persistent(conn, timeout, outbuf, outlen, inbuf, inlen);

	csp_close(conn);

	return status;
}